

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rbdl_errors.cc
# Opt level: O1

void __thiscall
RigidBodyDynamics::Errors::RBDLInvalidFileError::RBDLInvalidFileError
          (RBDLInvalidFileError *this,string *text)

{
  pointer pcVar1;
  string local_38;
  
  pcVar1 = (text->_M_dataplus)._M_p;
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_38,pcVar1,pcVar1 + text->_M_string_length);
  RBDLError::RBDLError(&this->super_RBDLError,&local_38);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_38._M_dataplus._M_p != &local_38.field_2) {
    operator_delete(local_38._M_dataplus._M_p,local_38.field_2._M_allocated_capacity + 1);
  }
  *(undefined ***)&this->super_RBDLError = &PTR__RBDLError_001979d0;
  return;
}

Assistant:

RBDLInvalidFileError::RBDLInvalidFileError(std::string text): RBDLError(text) {}